

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O1

void client(int count)

{
  bool bVar1;
  int iVar2;
  Addr local_180;
  undefined1 auStack_108 [8];
  Addr addr;
  TCPConnector *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  code *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  Poller *local_58 [2];
  code *local_48;
  code *pcStack_40;
  
  if (0 < count) {
    do {
      addr.sockaddr._0_8_ = 0;
      addr.sockaddr._8_1_ = '\0';
      addr.sockaddr._9_1_ = '\0';
      addr.sockaddr._10_1_ = '\0';
      addr.sockaddr._11_1_ = '\0';
      addr.sockaddr._12_1_ = '\0';
      addr.sockaddr._13_1_ = '\0';
      addr.sockaddr._14_1_ = '\0';
      addr.sockaddr._15_1_ = '\0';
      addr.sockaddr._16_8_ = 0;
      addr.sockaddr._24_8_ = 0;
      addr.sockaddr._32_8_ = 0;
      addr.sockaddr._40_8_ = 0;
      addr.sockaddr._48_8_ = 0;
      addr.sockaddr._56_8_ = 0;
      addr.sockaddr._64_8_ = 0;
      addr.sockaddr._72_8_ = 0;
      addr.sockaddr._80_8_ = 0;
      addr.sockaddr._88_8_ = 0;
      addr.sockaddr._96_8_ = 0;
      addr.sockaddr._104_8_ = 0;
      auStack_108 = (undefined1  [8])0xb8220002;
      iVar2 = inet_pton(2,ip,auStack_108 + 4);
      if (iVar2 < 0) {
        addr.sockaddr._104_8_ = addr.sockaddr._104_8_ & 0xffffffff00000000;
      }
      else {
        addr.sockaddr._104_8_ = 0x200000001;
      }
      local_180.addrType = 0;
      local_180.family = 0;
      local_58[0] = &poller_;
      std::__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<hwnet::TCPConnector>,hwnet::Poller*&,hwnet::Addr_const&,hwnet::Addr_const&>
                ((__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (allocator<hwnet::TCPConnector> *)&local_78,local_58,(Addr *)auStack_108,&local_180
                );
      local_58[1] = (Poller *)0x0;
      local_58[0] = (Poller *)onConnect;
      pcStack_40 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
      local_48 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
      uStack_70 = 0;
      local_78 = connectError;
      pcStack_60 = std::
                   _Function_handler<void_(int,_const_hwnet::Addr_&),_void_(*)(int,_const_hwnet::Addr_&)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(int,_const_hwnet::Addr_&),_void_(*)(int,_const_hwnet::Addr_&)>
                 ::_M_manager;
      bVar1 = hwnet::TCPConnector::Connect
                        (local_88,(ConnectCallback *)local_58,(ErrorCallback *)&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)((allocator<hwnet::TCPConnector> *)&local_78,
                    (allocator<hwnet::TCPConnector> *)&local_78,3);
      }
      if (local_48 != (code *)0x0) {
        (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
      }
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
      }
      if (!bVar1) {
        puts("connect error");
      }
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void client(int count) {
	for(int i = 0; i < count; ++i) {
		if(!TCPConnector::New(&poller_,Addr::MakeIP4Addr(ip,port))->Connect(onConnect,connectError)){
			printf("connect error\n");
		}
	}
}